

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O1

void Llb_ManPrepareVarLimits(Llb_Man_t *p)

{
  uint uVar1;
  Aig_Man_t *pAVar2;
  Llb_Mtr_t *pLVar3;
  Llb_Grp_t **ppLVar4;
  Llb_Grp_t *pLVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Int_t *pVVar9;
  int *__s;
  Vec_Int_t *pVVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  if (p->vVarBegs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarBegs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x5d,"void Llb_ManPrepareVarLimits(Llb_Man_t *)");
  }
  if (p->vVarEnds != (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarEnds == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x5e,"void Llb_ManPrepareVarLimits(Llb_Man_t *)");
  }
  pAVar2 = p->pAig;
  iVar13 = pAVar2->vObjs->nSize;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar12 = iVar13;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar12;
  if (iVar12 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar12 << 2);
  }
  pVVar9->pArray = __s;
  pVVar9->nSize = iVar13;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar13 << 2);
  }
  p->vVarEnds = pVVar9;
  iVar13 = pAVar2->vObjs->nSize;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar12 = iVar13;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar12;
  if (iVar12 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar10->pArray = piVar11;
  pVVar10->nSize = iVar13;
  if (piVar11 != (int *)0x0) {
    memset(piVar11,0,(long)iVar13 << 2);
  }
  p->vVarBegs = pVVar10;
  uVar1 = pAVar2->vObjs->nSize;
  pLVar3 = p->pMatrix;
  iVar13 = pLVar3->nCols;
  if (iVar12 < (int)uVar1) {
    if (piVar11 == (int *)0x0) {
      piVar11 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar11 = (int *)realloc(piVar11,(long)(int)uVar1 << 2);
    }
    pVVar10->pArray = piVar11;
    if (piVar11 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar10->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    piVar11 = pVVar10->pArray;
    uVar14 = 0;
    do {
      piVar11[uVar14] = iVar13;
      uVar14 = uVar14 + 1;
    } while (uVar1 != uVar14);
  }
  pVVar10->nSize = uVar1;
  if (0 < pLVar3->nCols) {
    ppLVar4 = pLVar3->pColGrps;
    lVar15 = 0;
    do {
      pLVar5 = ppLVar4[lVar15];
      pVVar6 = pLVar5->vIns;
      iVar13 = (int)lVar15;
      if (0 < pVVar6->nSize) {
        ppvVar7 = pVVar6->pArray;
        lVar16 = 0;
        do {
          iVar12 = *(int *)((long)ppvVar7[lVar16] + 0x24);
          lVar17 = (long)iVar12;
          if ((lVar17 < 0) || (pVVar10->nSize <= iVar12)) goto LAB_0081a1c6;
          if (lVar15 < pVVar10->pArray[lVar17]) {
            pVVar10->pArray[lVar17] = iVar13;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < pVVar6->nSize);
      }
      pVVar8 = pLVar5->vOuts;
      if (0 < pVVar8->nSize) {
        ppvVar7 = pVVar8->pArray;
        lVar16 = 0;
        do {
          iVar12 = *(int *)((long)ppvVar7[lVar16] + 0x24);
          lVar17 = (long)iVar12;
          if ((lVar17 < 0) || (pVVar10->nSize <= iVar12)) goto LAB_0081a1c6;
          if (lVar15 < pVVar10->pArray[lVar17]) {
            pVVar10->pArray[lVar17] = iVar13;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < pVVar8->nSize);
      }
      if (0 < pVVar6->nSize) {
        ppvVar7 = pVVar6->pArray;
        lVar16 = 0;
        do {
          iVar12 = *(int *)((long)ppvVar7[lVar16] + 0x24);
          lVar17 = (long)iVar12;
          if ((lVar17 < 0) || (pVVar9->nSize <= iVar12)) goto LAB_0081a1c6;
          if (__s[lVar17] < lVar15) {
            __s[lVar17] = iVar13;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < pVVar6->nSize);
      }
      if (0 < pVVar8->nSize) {
        ppvVar7 = pVVar8->pArray;
        lVar16 = 0;
        do {
          iVar12 = *(int *)((long)ppvVar7[lVar16] + 0x24);
          lVar17 = (long)iVar12;
          if ((lVar17 < 0) || (pVVar9->nSize <= iVar12)) {
LAB_0081a1c6:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (__s[lVar17] < lVar15) {
            __s[lVar17] = iVar13;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < pVVar8->nSize);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pLVar3->nCols);
  }
  return;
}

Assistant:

void Llb_ManPrepareVarLimits( Llb_Man_t * p )
{
    Llb_Grp_t * pGroup;
    Aig_Obj_t * pVar;
    int i, k;
    assert( p->vVarBegs == NULL );
    assert( p->vVarEnds == NULL );
    p->vVarEnds = Vec_IntStart( Aig_ManObjNumMax(p->pAig) ); 
    p->vVarBegs = Vec_IntStart( Aig_ManObjNumMax(p->pAig) ); 
    Vec_IntFill( p->vVarBegs, Aig_ManObjNumMax(p->pAig), p->pMatrix->nCols );

    for ( i = 0; i < p->pMatrix->nCols; i++ )
    {
        pGroup = p->pMatrix->pColGrps[i];

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) > i )
                Vec_IntWriteEntry( p->vVarBegs, pVar->Id, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) > i )
                Vec_IntWriteEntry( p->vVarBegs, pVar->Id, i );

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) < i )
                Vec_IntWriteEntry( p->vVarEnds, pVar->Id, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) < i )
                Vec_IntWriteEntry( p->vVarEnds, pVar->Id, i );
    }
}